

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directional_light.h
# Opt level: O2

void __thiscall
CGL::GLScene::DirectionalLight::DirectionalLight
          (DirectionalLight *this,LightInfo *light_info,Matrix4x4 *transform)

{
  double dVar1;
  double dVar2;
  undefined8 uVar3;
  ostream *poVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  anon_union_32_3_e2189aaa_for_Vector3D_0 local_88;
  anon_union_32_3_e2189aaa_for_Vector4D_0 local_68;
  Vector4D local_48;
  
  (this->super_SceneLight)._vptr_SceneLight = (_func_int **)&PTR_get_static_light_0029f880;
  (this->spectrum).field_0.field_0.z = 0.0;
  (this->spectrum).field_0.field_0.x = 0.0;
  (this->spectrum).field_0.field_0.y = 0.0;
  (this->direction).field_0.field_0.z = 0.0;
  (this->direction).field_0.field_0.x = 0.0;
  (this->direction).field_0.field_0.y = 0.0;
  (this->position).field_0.field_0.x = 0.0;
  (this->position).field_0.field_0.y = 0.0;
  (this->position).field_0.field_0.z = 0.0;
  dVar1 = (light_info->spectrum).field_0.field_0.y;
  dVar2 = (light_info->spectrum).field_0.field_0.z;
  uVar3 = *(undefined8 *)((long)&(light_info->spectrum).field_0 + 0x18);
  (this->spectrum).field_0.field_0.x = (light_info->spectrum).field_0.field_0.x;
  (this->spectrum).field_0.field_0.y = dVar1;
  (this->spectrum).field_0.field_0.z = dVar2;
  *(undefined8 *)((long)&(this->spectrum).field_0 + 0x18) = uVar3;
  local_68.field_0.x = (light_info->direction).field_0.field_0.x;
  local_68.field_0.y = (light_info->direction).field_0.field_0.y;
  local_68.field_0.z = (light_info->direction).field_0.field_0.z;
  local_68.field_0.w = 1.0;
  Matrix4x4::operator*(transform,(Vector4D *)&local_68.field_0);
  Vector4D::to3D(&local_48);
  auVar5._8_4_ = 0;
  auVar5._0_8_ = -local_88.field_0.z;
  auVar5._12_4_ = 0x80000000;
  *(undefined4 *)&(this->position).field_0 = local_88._0_4_;
  *(uint *)((long)&(this->position).field_0 + 4) = local_88._4_4_ ^ 0x80000000;
  *(undefined4 *)((long)&(this->position).field_0 + 8) = local_88._8_4_;
  *(uint *)((long)&(this->position).field_0 + 0xc) = local_88._12_4_ ^ 0x80000000;
  dVar1 = (double)vmovlps_avx(auVar5);
  (this->position).field_0.field_0.z = dVar1;
  poVar4 = std::operator<<((ostream *)&std::cout,"found directional light with position ");
  auVar6._0_8_ = -(this->position).field_0.field_0.z;
  auVar6._8_4_ = 0;
  auVar6._12_4_ = 0x80000000;
  local_88._0_4_ = *(undefined4 *)&(this->position).field_0;
  local_88._8_4_ = *(undefined4 *)((long)&(this->position).field_0 + 8);
  local_88._4_4_ = *(uint *)((long)&(this->position).field_0 + 4) ^ 0x80000000;
  local_88._12_4_ = *(uint *)((long)&(this->position).field_0 + 0xc) ^ 0x80000000;
  local_88.field_0.z = (double)vmovlps_avx(auVar6);
  poVar4 = (ostream *)CGL::operator<<(poVar4,(Vector3D *)&local_88.field_0);
  poVar4 = std::operator<<(poVar4," and spec ");
  poVar4 = (ostream *)CGL::operator<<(poVar4,&this->spectrum);
  std::endl<char,std::char_traits<char>>(poVar4);
  Vector3D::unit((Vector3D *)&local_88.field_0,&this->position);
  (this->direction).field_0.field_0.x = (double)CONCAT44(local_88._4_4_,local_88._0_4_);
  (this->direction).field_0.field_0.y = (double)CONCAT44(local_88._12_4_,local_88._8_4_);
  (this->direction).field_0.field_0.z = local_88.field_0.z;
  *(undefined8 *)((long)&(this->direction).field_0 + 0x18) = local_88._24_8_;
  return;
}

Assistant:

DirectionalLight(const Collada::LightInfo& light_info, 
                   const Matrix4x4& transform) {
    this->spectrum = light_info.spectrum;
//    this->direction = -(transform * Vector4D(light_info.direction, 1)).to3D();
//    this->direction.normalize();
    // Begin -- Lens Flare
    this->position = -(transform * Vector4D(light_info.direction, 1)).to3D();
    std::cout << "found directional light with position " << -this->position << " and spec " << this->spectrum << std::endl;
    this->direction = (this->position).unit();
    // End -- Lens Flare

  }